

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereLoopOutputAdjust(WhereClause *pWC,WhereLoop *pLoop,LogEst nRow)

{
  ushort uVar1;
  ulong uVar2;
  WhereTerm *pWVar3;
  bool bVar4;
  uint in_EAX;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  undefined6 in_register_00000012;
  ulong uVar9;
  WhereTerm *pWVar10;
  uint uVar11;
  int k;
  uint local_38;
  uint local_34;
  
  uVar9 = CONCAT62(in_register_00000012,nRow);
  if (pWC->nTerm < 1) {
    uVar11 = 0;
  }
  else {
    local_34 = (uint)uVar9;
    uVar9 = pLoop->maskSelf;
    uVar2 = pLoop->prereq;
    pWVar10 = pWC->a;
    uVar11 = 0;
    iVar8 = pWC->nTerm;
    local_38 = in_EAX;
    do {
      if ((pWVar10->wtFlags & 2) != 0) break;
      if (((pLoop->maskSelf & pWVar10->prereqAll) != 0) &&
         ((pWVar10->prereqAll & ~(uVar9 | uVar2)) == 0)) {
        uVar1 = pLoop->nLTerm;
        uVar6 = (ulong)uVar1;
        if (uVar1 != 0) {
          uVar6 = (ulong)uVar1;
          do {
            pWVar3 = pLoop->aLTerm[uVar6 - 1];
            if ((pWVar3 != (WhereTerm *)0x0) &&
               ((pWVar3 == pWVar10 ||
                ((-1 < (long)pWVar3->iParent && (pWC->a + pWVar3->iParent == pWVar10))))))
            goto LAB_0016e759;
            bVar4 = 1 < (long)uVar6;
            uVar6 = uVar6 - 1;
          } while (bVar4);
          uVar6 = 0;
        }
LAB_0016e759:
        if ((int)uVar6 < 1) {
          if (pWVar10->truthProb < 1) {
            pLoop->nOut = pLoop->nOut + pWVar10->truthProb;
          }
          else {
            pLoop->nOut = pLoop->nOut + -1;
            if ((pWVar10->eOperator & 0x82) != 0) {
              iVar5 = sqlite3ExprIsInteger(pWVar10->pExpr->pRight,(int *)&local_38);
              uVar7 = local_38 + 1;
              local_38 = 0x14;
              if (uVar7 < 3) {
                local_38 = 10;
              }
              if (iVar5 == 0) {
                local_38 = 0x14;
              }
              if (uVar11 < local_38) {
                uVar11 = local_38;
              }
            }
          }
        }
      }
      pWVar10 = pWVar10 + 1;
      bVar4 = 1 < iVar8;
      iVar8 = iVar8 + -1;
    } while (bVar4);
    uVar9 = (ulong)local_34;
  }
  iVar8 = (int)(short)uVar9 - uVar11;
  if (iVar8 < pLoop->nOut) {
    pLoop->nOut = (LogEst)iVar8;
  }
  return;
}

Assistant:

static void whereLoopOutputAdjust(
  WhereClause *pWC,      /* The WHERE clause */
  WhereLoop *pLoop,      /* The loop to adjust downward */
  LogEst nRow            /* Number of rows in the entire table */
){
  WhereTerm *pTerm, *pX;
  Bitmask notAllowed = ~(pLoop->prereq|pLoop->maskSelf);
  int i, j, k;
  LogEst iReduce = 0;    /* pLoop->nOut should not exceed nRow-iReduce */

  assert( (pLoop->wsFlags & WHERE_AUTO_INDEX)==0 );
  for(i=pWC->nTerm, pTerm=pWC->a; i>0; i--, pTerm++){
    if( (pTerm->wtFlags & TERM_VIRTUAL)!=0 ) break;
    if( (pTerm->prereqAll & pLoop->maskSelf)==0 ) continue;
    if( (pTerm->prereqAll & notAllowed)!=0 ) continue;
    for(j=pLoop->nLTerm-1; j>=0; j--){
      pX = pLoop->aLTerm[j];
      if( pX==0 ) continue;
      if( pX==pTerm ) break;
      if( pX->iParent>=0 && (&pWC->a[pX->iParent])==pTerm ) break;
    }
    if( j<0 ){
      if( pTerm->truthProb<=0 ){
        /* If a truth probability is specified using the likelihood() hints,
        ** then use the probability provided by the application. */
        pLoop->nOut += pTerm->truthProb;
      }else{
        /* In the absence of explicit truth probabilities, use heuristics to
        ** guess a reasonable truth probability. */
        pLoop->nOut--;
        if( pTerm->eOperator&(WO_EQ|WO_IS) ){
          Expr *pRight = pTerm->pExpr->pRight;
          testcase( pTerm->pExpr->op==TK_IS );
          if( sqlite3ExprIsInteger(pRight, &k) && k>=(-1) && k<=1 ){
            k = 10;
          }else{
            k = 20;
          }
          if( iReduce<k ) iReduce = k;
        }
      }
    }
  }
  if( pLoop->nOut > nRow-iReduce )  pLoop->nOut = nRow - iReduce;
}